

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav * drwav_open_memory_ex
                  (void *data,size_t dataSize,drwav_chunk_proc onChunk,void *pChunkUserData,
                  drwav_uint32 flags)

{
  drwav *pdVar1;
  drwav_uint8 *local_18;
  size_t sStack_10;
  size_t local_8;
  
  if (dataSize == 0 || data == (void *)0x0) {
    return (drwav *)0x0;
  }
  local_8 = 0;
  local_18 = (drwav_uint8 *)data;
  sStack_10 = dataSize;
  pdVar1 = drwav_open_ex(drwav__on_read_memory,drwav__on_seek_memory,onChunk,&local_18,
                         pChunkUserData,flags);
  if (pdVar1 != (drwav *)0x0) {
    (pdVar1->memoryStream).currentReadPos = local_8;
    (pdVar1->memoryStream).data = local_18;
    (pdVar1->memoryStream).dataSize = sStack_10;
    pdVar1->pUserData = &pdVar1->memoryStream;
  }
  return pdVar1;
}

Assistant:

drwav* drwav_open_memory_ex(const void* data, size_t dataSize, drwav_chunk_proc onChunk, void* pChunkUserData, drwav_uint32 flags)
{
    if (data == NULL || dataSize == 0) {
        return NULL;
    }

    drwav__memory_stream memoryStream;
    drwav_zero_memory(&memoryStream, sizeof(memoryStream));
    memoryStream.data = (const unsigned char*)data;
    memoryStream.dataSize = dataSize;
    memoryStream.currentReadPos = 0;

    drwav* pWav = drwav_open_ex(drwav__on_read_memory, drwav__on_seek_memory, onChunk, (void*)&memoryStream, pChunkUserData, flags);
    if (pWav == NULL) {
        return NULL;
    }

    pWav->memoryStream = memoryStream;
    pWav->pUserData = &pWav->memoryStream;
    return pWav;
}